

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateCreateVectorField
          (KotlinGenerator *this,FieldDef *field,CodeWriter *writer,IDLOptions *options)

{
  Type type;
  size_t sVar1;
  BaseType *type_00;
  Type *type_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string method_name;
  undefined1 in_stack_ffffffffffffff18 [24];
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  BaseType local_a0;
  BaseType BStack_9c;
  Parser *pPStack_98;
  EnumDef *pEStack_90;
  uint16_t uStack_88;
  undefined6 uStack_86;
  
  local_a0 = (field->value).type.element;
  uStack_88 = (field->value).type.fixed_length;
  BStack_9c = BASE_TYPE_NONE;
  pPStack_98 = (Parser *)(field->value).type.struct_def;
  pEStack_90 = (field->value).type.enum_def;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff80,"create",(allocator<char> *)local_c0._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff20,"vector",(allocator<char> *)&stack0xffffffffffffff1f
            );
  (*(this->namer_).super_Namer._vptr_Namer[2])
            (&stack0xffffffffffffffc0,&this->namer_,&stack0xffffffffffffff80,field,
             &stack0xffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  GenTypeBasic_abi_cxx11_((string *)&local_c0,(KotlinGenerator *)&stack0xffffffffffffff60,type_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff20,"builder: FlatBufferBuilder, data: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff20,"Array");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::~string((string *)local_c0._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff20,"size",(allocator<char> *)&stack0xffffffffffffff1f);
  sVar1 = InlineSize((Type *)&stack0xffffffffffffff60);
  NumToString<unsigned_long>((string *)&local_c0,sVar1);
  CodeWriter::SetValue(writer,(string *)&stack0xffffffffffffff20,(string *)&local_c0);
  std::__cxx11::string::~string((string *)local_c0._M_pod_data);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff20,"align",(allocator<char> *)&stack0xffffffffffffff1f)
  ;
  sVar1 = InlineAlignment((Type *)&stack0xffffffffffffff60);
  NumToString<unsigned_long>((string *)&local_c0,sVar1);
  CodeWriter::SetValue(writer,(string *)&stack0xffffffffffffff20,(string *)&local_c0);
  std::__cxx11::string::~string((string *)local_c0._M_pod_data);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff20,"root",(allocator<char> *)&stack0xffffffffffffff1f);
  GenMethod_abi_cxx11_((string *)&local_c0,(KotlinGenerator *)&stack0xffffffffffffff60,type_01);
  CodeWriter::SetValue(writer,(string *)&stack0xffffffffffffff20,(string *)&local_c0);
  std::__cxx11::string::~string((string *)local_c0._M_pod_data);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff20,"cast",(allocator<char> *)&stack0xffffffffffffff1f);
  type._2_6_ = uStack_86;
  type.base_type._0_2_ = uStack_88;
  type.struct_def = (StructDef *)in_stack_ffffffffffffff18._0_8_;
  type.enum_def = (EnumDef *)in_stack_ffffffffffffff18._8_8_;
  type.fixed_length = in_stack_ffffffffffffff18._16_2_;
  type._26_6_ = in_stack_ffffffffffffff18._18_6_;
  CastToSigned_abi_cxx11_(type);
  CodeWriter::SetValue(writer,(string *)&stack0xffffffffffffff20,(string *)&local_c0);
  std::__cxx11::string::~string((string *)local_c0._M_pod_data);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  if ((local_a0 < BASE_TYPE_FLOAT) &&
     ((0x552U >> (local_a0 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa0,"@kotlin.ExperimentalUnsignedTypes",
               (allocator<char> *)&stack0xffffffffffffff20);
    CodeWriter::operator+=(writer,(string *)&stack0xffffffffffffffa0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff20,"Int",(allocator<char> *)&stack0xffffffffffffff1f);
  local_c0._8_8_ = 0;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:709:9)>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:709:9)>
             ::_M_manager;
  local_c0._M_unused._M_object = writer;
  GenerateFun(writer,(string *)&stack0xffffffffffffffc0,(string *)&stack0xffffffffffffff80,
              (string *)&stack0xffffffffffffff20,(function<void_()> *)&local_c0,
              options->gen_jvmstatic);
  std::_Function_base::~_Function_base((_Function_base *)&local_c0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void GenerateCreateVectorField(FieldDef &field, CodeWriter &writer,
                                 const IDLOptions options) const {
    auto vector_type = field.value.type.VectorType();
    auto method_name = namer_.Method("create", field, "vector");
    auto params = "builder: FlatBufferBuilder, data: " +
                  GenTypeBasic(vector_type.base_type) + "Array";
    writer.SetValue("size", NumToString(InlineSize(vector_type)));
    writer.SetValue("align", NumToString(InlineAlignment(vector_type)));
    writer.SetValue("root", GenMethod(vector_type));
    writer.SetValue("cast", CastToSigned(vector_type));

    if (IsUnsigned(vector_type.base_type)) {
      writer += "@kotlin.ExperimentalUnsignedTypes";
    }
    GenerateFun(
        writer, method_name, params, "Int",
        [&]() {
          writer += "builder.startVector({{size}}, data.size, {{align}})";
          writer += "for (i in data.size - 1 downTo 0) {";
          writer.IncrementIdentLevel();
          writer += "builder.add{{root}}(data[i]{{cast}})";
          writer.DecrementIdentLevel();
          writer += "}";
          writer += "return builder.endVector()";
        },
        options.gen_jvmstatic);
  }